

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  int iVar1;
  IResultCapture *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  char c;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_f5;
  OfType local_f4;
  string local_f0;
  Capturer *local_d0;
  SourceLineInfo *local_c8;
  char *local_c0;
  StringRef local_b8;
  _Deque_base<char,_std::allocator<char>_> local_a8;
  ReusableStringStream local_58;
  SourceLineInfo local_40;
  
  local_b8.m_size = macroName.m_size;
  local_b8.m_start = macroName.m_start;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f4 = resultType;
  local_c8 = lineInfo;
  pIVar2 = getResultCapture();
  this->m_resultCapture = pIVar2;
  this->m_captured = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_a8,0);
  if (names.m_size == 0) {
    uVar5 = 0;
    names.m_size = 0;
  }
  else {
    uVar7 = 0;
    uVar3 = 0;
    do {
      local_f5 = names.m_start[uVar7];
      uVar5 = uVar3;
      if (local_f5 < 0x5b) {
        switch(local_f5) {
        case 0x22:
        case 0x27:
          while( true ) {
            uVar3 = uVar7;
            uVar7 = uVar3 + 1;
            if (names.m_size <= uVar7) {
              ReusableStringStream::ReusableStringStream(&local_58);
              local_40.file =
                   "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/catch.hpp"
              ;
              local_40.line = 0x2e6d;
              operator<<(local_58.m_oss,&local_40);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_58.m_oss,": Internal Catch2 error: ",0x19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_58.m_oss,"CAPTURE parsing encountered unmatched quote",
                         0x2b);
              std::__cxx11::stringbuf::str();
              throw_logic_error(&local_f0);
            }
            if (names.m_start[uVar7] == local_f5) break;
            if (names.m_start[uVar7] == 0x5c) {
              uVar7 = uVar3 + 2;
            }
          }
          break;
        case 0x28:
          goto switchD_0011eda1_caseD_28;
        case 0x29:
          goto switchD_0011eda1_caseD_29;
        case 0x2c:
          uVar5 = uVar7;
          if ((uVar3 != uVar7) &&
             (uVar5 = uVar3,
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       &local_b8,local_c8,&local_f4);
            uVar5 = (uVar7 - uVar3) + 1;
            local_d0 = this;
            while (((byte)names.m_start[uVar3] == 0x2c ||
                   (iVar1 = isspace((uint)(byte)names.m_start[uVar3]), iVar1 != 0))) {
              uVar3 = uVar3 + 1;
              uVar5 = uVar5 - 1;
            }
            local_c0 = names.m_start + uVar3;
            pbVar8 = (byte *)(names.m_start + uVar7);
            while ((*pbVar8 == 0x2c || (iVar1 = isspace((uint)*pbVar8), iVar1 != 0))) {
              uVar5 = uVar5 - 1;
              pbVar8 = pbVar8 + -1;
            }
            uVar4 = names.m_size - uVar3;
            pcVar6 = local_c0;
            if (names.m_size < uVar3 || uVar4 == 0) {
              pcVar6 = "";
            }
            if (uVar5 <= uVar4) {
              uVar4 = uVar5;
            }
            if (names.m_size <= uVar3) {
              uVar4 = 0;
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,pcVar6,pcVar6 + uVar4);
            this = local_d0;
            std::__cxx11::string::operator=
                      ((string *)
                       &(local_d0->m_messages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append
                      ((char *)&(this->m_messages).
                                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].message);
            uVar5 = uVar7;
          }
        }
      }
      else {
        if (local_f5 < 0x7b) {
          if (local_f5 != 0x5b) {
            if (local_f5 != 0x5d) goto switchD_0011eda1_caseD_23;
switchD_0011eda1_caseD_29:
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto switchD_0011eda1_caseD_23;
          }
        }
        else {
          if (local_f5 == 0x7d) goto switchD_0011eda1_caseD_29;
          if (local_f5 != 0x7b) goto switchD_0011eda1_caseD_23;
        }
switchD_0011eda1_caseD_28:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_a8,(char *)&local_f5);
        }
        else {
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_f5;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
switchD_0011eda1_caseD_23:
      uVar7 = uVar7 + 1;
      uVar3 = uVar5;
    } while (uVar7 < names.m_size);
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,&local_b8,
             local_c8,&local_f4);
  while (((byte)names.m_start[uVar5] == 0x2c ||
         (iVar1 = isspace((uint)(byte)names.m_start[uVar5]), iVar1 != 0))) {
    uVar5 = uVar5 + 1;
  }
  pbVar8 = (byte *)(names.m_start + names.m_size);
  uVar7 = names.m_size - uVar5;
  while( true ) {
    pbVar8 = pbVar8 + -1;
    if ((*pbVar8 != 0x2c) && (iVar1 = isspace((uint)*pbVar8), iVar1 == 0)) break;
    uVar7 = uVar7 - 1;
  }
  uVar3 = names.m_size - uVar5;
  pcVar6 = "";
  if (uVar5 <= names.m_size && uVar3 != 0) {
    pcVar6 = names.m_start + uVar5;
  }
  if (uVar7 <= uVar3) {
    uVar3 = uVar7;
  }
  uVar7 = 0;
  if (uVar5 < names.m_size) {
    uVar7 = uVar3;
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar6,pcVar6 + uVar7);
  std::__cxx11::string::operator=
            ((string *)
             &(this->m_messages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].message,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append
            ((char *)&(this->m_messages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].message);
  clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_a8);
  return;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }